

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

bool __thiscall PruneReplayer::filter_shader_module(PruneReplayer *this,Hash hash)

{
  size_type sVar1;
  bool bVar2;
  Hash local_10;
  
  local_10 = hash;
  sVar1 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->banned_modules)._M_h,&local_10);
  if (sVar1 == 0) {
    if ((this->filter_modules)._M_h._M_element_count == 0) {
      bVar2 = true;
    }
    else {
      sVar1 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->filter_modules)._M_h,&local_10);
      bVar2 = sVar1 != 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool filter_shader_module(Hash hash) const
	{
		if (banned_modules.count(hash))
			return false;
		if (filter_modules.empty())
			return true;

		return filter_modules.count(hash) != 0;
	}